

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O1

void __thiscall
bgui::ImageWindow::ImageWindow
          (ImageWindow *this,ImageFloat *image,int x,int y,int w,int h,double vmin,double vmax)

{
  ImageAdapter<float> *this_00;
  ostream *poVar1;
  ostringstream os;
  char *local_1c8;
  char local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  BaseWindow::BaseWindow(&this->super_BaseWindow,"Image",100,100);
  (this->super_BaseWindow)._vptr_BaseWindow = (_func_int **)&PTR__ImageWindow_00121720;
  (this->helptext)._M_dataplus._M_p = (pointer)&(this->helptext).field_2;
  (this->helptext)._M_string_length = 0;
  (this->helptext).field_2._M_local_buf[0] = '\0';
  this_00 = (ImageAdapter<float> *)operator_new(0xa8);
  ImageAdapter<float>::ImageAdapter(this_00,image,vmin,vmax,false);
  this->adapt = (ImageAdapterBase *)0x0;
  this->del = false;
  this->lastkey = '\0';
  this->imx = 0;
  this->imy = 0;
  this->showinfo = false;
  (anonymous_namespace)::createHelpText_abi_cxx11_();
  std::__cxx11::string::_M_append((char *)&this->helptext,(ulong)local_1a8[0]);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0]);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Image - ",8);
  poVar1 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,image->depth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"float",5);
  std::__cxx11::stringbuf::str();
  BaseWindow::setTitle(&this->super_BaseWindow,local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (w < 1) {
    w = (int)image->width;
  }
  if (h < 1) {
    h = (int)image->height;
  }
  setAdapter(this,(ImageAdapterBase *)this_00,true,keep_none,w,h,false);
  BaseWindow::setVisible(&this->super_BaseWindow,true);
  if (-1 < (y | x)) {
    BaseWindow::setPosition(&this->super_BaseWindow,x,y);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

ImageWindow::ImageWindow(const gimage::ImageFloat &image, int x, int y, int w, int h,
                         double vmin, double vmax) : BaseWindow("Image", 100, 100)
{
  ImageAdapterBase *p=new ImageAdapter<float>(&image, vmin, vmax);

  adapt=0;
  del=false;
  lastkey='\0';
  imx=imy=0;
  showinfo=false;

  addHelpText(createHelpText());

  std::ostringstream os;

  os << "Image - " << image.getWidth() << "x" << image.getHeight() << "x" <<
     image.getDepth() << " " << image.getTypeDescription();

  setTitle(os.str().c_str());

  if (w <= 0)
  {
    w=image.getWidth();
  }

  if (h <= 0)
  {
    h=image.getHeight();
  }

  setAdapter(p, true, keep_none, w, h);
  setVisible(true);

  if (x >= 0 && y >= 0)
  {
    setPosition(x, y);
  }
}